

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-bitflag.c
# Opt level: O0

_Bool flag_union(bitflag *flags1,bitflag *flags2,size_t size)

{
  _Bool local_29;
  ulong uStack_28;
  _Bool delta;
  size_t i;
  size_t size_local;
  bitflag *flags2_local;
  bitflag *flags1_local;
  
  local_29 = false;
  for (uStack_28 = 0; uStack_28 < size; uStack_28 = uStack_28 + 1) {
    if (((flags1[uStack_28] ^ 0xff) & flags2[uStack_28]) != 0) {
      local_29 = true;
    }
    flags1[uStack_28] = flags1[uStack_28] | flags2[uStack_28];
  }
  return local_29;
}

Assistant:

bool flag_union(bitflag *flags1, const bitflag *flags2, const size_t size)
{
	size_t i;
	bool delta = false;

	for (i = 0; i < size; i++) {
		/* !flag_is_subset() */
		if (~flags1[i] & flags2[i]) delta = true;

		flags1[i] |= flags2[i];
	}

	return delta;
}